

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

MIR_item_t_conflict
new_func_arr(MIR_context_t ctx,char *name,size_t nres,MIR_type_t *res_types,size_t nargs,
            int vararg_p,MIR_var_t *vars)

{
  int iVar1;
  MIR_type_t MVar2;
  MIR_reg_t MVar3;
  MIR_error_func_t p_Var4;
  char *pcVar5;
  MIR_type_t local_9c;
  MIR_reg_t reg;
  MIR_type_t type;
  char *stored_name;
  size_t i_2;
  size_t i_1;
  size_t i;
  MIR_func_t func;
  MIR_item_t_conflict tab_item;
  MIR_item_t_conflict func_item;
  char *pcStack_30;
  int vararg_p_local;
  size_t nargs_local;
  MIR_type_t *res_types_local;
  size_t nres_local;
  char *name_local;
  MIR_context_t ctx_local;
  
  func_item._4_4_ = vararg_p;
  pcStack_30 = (char *)nargs;
  nargs_local = (size_t)res_types;
  res_types_local = (MIR_type_t *)nres;
  nres_local = (size_t)name;
  name_local = (char *)ctx;
  if (ctx->curr_func != (MIR_func_t)0x0) {
    p_Var4 = MIR_get_error_func(ctx);
    (*p_Var4)(MIR_nested_func_error,"Creating function when previous function %s is not finished",
              **(undefined8 **)(name_local + 0x90));
  }
  if ((pcStack_30 == (char *)0x0) && (func_item._4_4_ != 0)) {
    p_Var4 = MIR_get_error_func((MIR_context_t)name_local);
    (*p_Var4)(MIR_vararg_func_error,"Variable arg function %s w/o any mandatory argument",nres_local
             );
  }
  for (i_1 = 0; i_1 < res_types_local; i_1 = i_1 + 1) {
    iVar1 = wrong_type_p(*(MIR_type_t *)(nargs_local + i_1 * 4));
    if (iVar1 != 0) {
      p_Var4 = MIR_get_error_func((MIR_context_t)name_local);
      (*p_Var4)(MIR_wrong_type_error,"wrong result type in func %s",nres_local);
    }
  }
  tab_item = create_item((MIR_context_t)name_local,MIR_func_item,"function");
  i = (size_t)malloc((long)res_types_local * 4 + 0x88);
  (tab_item->u).func = (MIR_func_t)i;
  *(size_t *)(name_local + 0x90) = i;
  if ((MIR_func_t)i == (MIR_func_t)0x0) {
    free(tab_item);
    p_Var4 = MIR_get_error_func((MIR_context_t)name_local);
    (*p_Var4)(MIR_alloc_error,"Not enough memory for creation of func %s",nres_local);
  }
  pcVar5 = get_ctx_str((MIR_context_t)name_local,(char *)nres_local);
  *(char **)i = pcVar5;
  *(MIR_item_t_conflict *)(i + 8) = tab_item;
  *(int *)(i + 0x38) = (int)res_types_local;
  *(size_t *)(i + 0x48) = i + 0x88;
  for (i_2 = 0; i_2 < res_types_local; i_2 = i_2 + 1) {
    MVar2 = canon_type(*(MIR_type_t *)(nargs_local + i_2 * 4));
    *(MIR_type_t *)(*(long *)(i + 0x48) + i_2 * 4) = MVar2;
  }
  func = (MIR_func_t)add_item((MIR_context_t)name_local,tab_item);
  if (func != (MIR_func_t)tab_item) {
    __assert_fail("tab_item == func_item",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0x569,
                  "MIR_item_t new_func_arr(MIR_context_t, const char *, size_t, MIR_type_t *, size_t, int, MIR_var_t *)"
                 );
  }
  DLIST_MIR_insn_t_init((DLIST_MIR_insn_t *)(i + 0x18));
  DLIST_MIR_insn_t_init((DLIST_MIR_insn_t *)(i + 0x28));
  VARR_MIR_var_tcreate((VARR_MIR_var_t **)(i + 0x58),(size_t)(pcStack_30 + 8));
  *(undefined8 *)(i + 0x60) = 0;
  *(int *)(i + 0x3c) = (int)pcStack_30;
  *(undefined4 *)(i + 0x40) = 0;
  *(bool *)(i + 0x50) = func_item._4_4_ != 0;
  *(undefined1 *)(i + 0x52) = 0;
  *(undefined1 *)(i + 0x51) = 0;
  *(undefined4 *)(i + 0x44) = 0;
  *(undefined8 *)(i + 0x70) = 0;
  *(undefined8 *)(i + 0x68) = 0;
  *(undefined8 *)(i + 0x80) = 0;
  func_regs_init((MIR_context_t)name_local,(MIR_func_t)i);
  stored_name = (char *)0x0;
  while( true ) {
    if (pcStack_30 <= stored_name) {
      return tab_item;
    }
    local_9c = canon_type(vars[(long)stored_name].type);
    if (((local_9c != MIR_T_F) && (local_9c != MIR_T_D)) && (local_9c != MIR_T_LD)) {
      local_9c = MIR_T_I64;
    }
    MVar3 = create_func_reg((MIR_context_t)name_local,(MIR_func_t)i,vars[(long)stored_name].name,
                            (char *)0x0,(int)stored_name + 1,local_9c,0,(char **)&reg);
    if (stored_name + 1 != (char *)(ulong)MVar3) break;
    vars[(long)stored_name].name = _reg;
    VARR_MIR_var_tpush(*(VARR_MIR_var_t **)(i + 0x58),vars[(long)stored_name]);
    stored_name = stored_name + 1;
  }
  __assert_fail("i + 1 == reg",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                ,0x57d,
                "MIR_item_t new_func_arr(MIR_context_t, const char *, size_t, MIR_type_t *, size_t, int, MIR_var_t *)"
               );
}

Assistant:

static MIR_item_t new_func_arr (MIR_context_t ctx, const char *name, size_t nres,
                                MIR_type_t *res_types, size_t nargs, int vararg_p,
                                MIR_var_t *vars) {
  MIR_item_t func_item, tab_item;
  MIR_func_t func;

  if (curr_func != NULL)
    MIR_get_error_func (ctx) (MIR_nested_func_error,
                              "Creating function when previous function %s is not finished",
                              curr_func->name);
  if (nargs == 0 && vararg_p)
    MIR_get_error_func (ctx) (MIR_vararg_func_error,
                              "Variable arg function %s w/o any mandatory argument", name);
  for (size_t i = 0; i < nres; i++)
    if (wrong_type_p (res_types[i]))
      MIR_get_error_func (ctx) (MIR_wrong_type_error, "wrong result type in func %s", name);
  func_item = create_item (ctx, MIR_func_item, "function");
  curr_func = func_item->u.func = func
    = malloc (sizeof (struct MIR_func) + nres * sizeof (MIR_type_t));
  if (func == NULL) {
    free (func_item);
    MIR_get_error_func (ctx) (MIR_alloc_error, "Not enough memory for creation of func %s", name);
  }
  func->name = get_ctx_str (ctx, name);
  func->func_item = func_item;
  func->nres = (uint32_t) nres;
  func->res_types = (MIR_type_t *) ((char *) func + sizeof (struct MIR_func));
  for (size_t i = 0; i < nres; i++) func->res_types[i] = canon_type (res_types[i]);
  tab_item = add_item (ctx, func_item);
  mir_assert (tab_item == func_item);
  DLIST_INIT (MIR_insn_t, func->insns);
  DLIST_INIT (MIR_insn_t, func->original_insns);
  VARR_CREATE (MIR_var_t, func->vars, nargs + 8);
  func->global_vars = NULL;
  func->nargs = (uint32_t) nargs;
  func->last_temp_num = 0;
  func->vararg_p = vararg_p != 0;
  func->expr_p = func->jret_p = FALSE;
  func->n_inlines = 0;
  func->machine_code = func->call_addr = NULL;
  func->first_lref = NULL;
  func_regs_init (ctx, func);
  for (size_t i = 0; i < nargs; i++) {
    char *stored_name;
    MIR_type_t type = canon_type (vars[i].type);
    MIR_reg_t reg
      = create_func_reg (ctx, func, vars[i].name, NULL, (MIR_reg_t) (i + 1),
                         type == MIR_T_F || type == MIR_T_D || type == MIR_T_LD ? type : MIR_T_I64,
                         FALSE, &stored_name);
    mir_assert (i + 1 == reg);
    vars[i].name = stored_name;
    VARR_PUSH (MIR_var_t, func->vars, vars[i]);
  }
  return func_item;
}